

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

int mfclose(mFILE *mf)

{
  if (mf != (mFILE *)0x0) {
    mfflush(mf);
    if ((FILE *)mf->fp != (FILE *)0x0) {
      fclose((FILE *)mf->fp);
    }
    mfdestroy(mf);
    return 0;
  }
  return -1;
}

Assistant:

int mfclose(mFILE *mf) {
    if (!mf)
	return -1;

    mfflush(mf);

    if (mf->fp)
	fclose(mf->fp);

    mfdestroy(mf);

    return 0;
}